

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
hta::detail::make_exception<const_char_*,_unsigned_long,_const_char_*>::operator()
          (make_exception<const_char_*,_unsigned_long,_const_char_*> *this,stringstream *msg,
          char *arg,unsigned_long args,char *args_1)

{
  make_exception<unsigned_long,_const_char_*> local_19;
  
  std::operator<<((ostream *)(msg + 0x10),arg);
  make_exception<unsigned_long,_const_char_*>::operator()(&local_19,msg,args,args_1);
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }